

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O1

int drmp3dec_decode_frame
              (drmp3dec *dec,uchar *mp3,int mp3_bytes,void *pcm,drmp3dec_frame_info *info)

{
  long *plVar1;
  char *pcVar2;
  int *piVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  byte bVar7;
  ushort uVar8;
  short sVar9;
  short sVar10;
  undefined2 uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined8 uVar43;
  byte bVar44;
  byte bVar45;
  uint uVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  drmp3_uint32 dVar50;
  uint uVar51;
  drmp3_uint32 dVar52;
  drmp3_uint32 dVar53;
  long lVar54;
  long lVar55;
  drmp3_bs *pdVar56;
  undefined1 *puVar57;
  float *pfVar58;
  byte bVar59;
  undefined1 uVar60;
  int iVar61;
  uint uVar62;
  ulong uVar63;
  undefined1 (*pauVar64) [16];
  uint uVar65;
  undefined1 (*pauVar66) [16];
  ulong uVar67;
  float *pfVar68;
  int iVar69;
  uint uVar70;
  long lVar71;
  drmp3_uint8 *pdVar72;
  undefined1 (*pauVar73) [16];
  long *plVar74;
  void *pvVar75;
  float *pfVar76;
  uint uVar77;
  undefined4 *__dest;
  void *__dest_00;
  float *pfVar78;
  byte bVar79;
  undefined1 *puVar80;
  float (*overlap) [288];
  ulong uVar81;
  uint *puVar82;
  uint uVar83;
  uint uVar84;
  uint uVar85;
  uint uVar86;
  uint uVar87;
  drmp3_uint8 *pdVar88;
  uchar *puVar89;
  byte *pbVar90;
  drmp3_bs *pdVar91;
  uchar *puVar92;
  drmp3dec_frame_info *pdVar93;
  ulong uVar94;
  uint uVar95;
  uchar *h;
  drmp3d_sample_t *pdVar96;
  byte bVar97;
  bool bVar98;
  float fVar99;
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar102;
  undefined1 in_XMM1 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar103;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  int iVar152;
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  drmp3_uint8 scf_size [4];
  drmp3_bs bs_frame [1];
  drmp3_L12_scale_info sci [1];
  drmp3dec_scratch scratch;
  ulong local_43f0;
  undefined1 *local_43e0;
  ulong local_43d0;
  drmp3_uint8 *local_43a8;
  byte local_439c [4];
  drmp3_bs local_4398;
  drmp3d_sample_t *local_4380;
  uchar *local_4378;
  drmp3dec_frame_info *local_4370;
  drmp3_uint8 *local_4368;
  ulong local_4360;
  ulong local_4358;
  float *local_4350;
  ulong local_4348;
  long local_4340;
  undefined4 local_4338;
  float fStack_4334;
  undefined4 local_4330;
  byte local_4038;
  byte local_4037;
  byte local_4036 [64];
  byte abStack_3ff6 [70];
  drmp3_bs local_3fb0;
  drmp3_uint8 local_3fa0 [2816];
  long local_34a0;
  ushort local_3498 [3];
  byte local_3492;
  undefined2 local_3491;
  byte local_348f [5];
  undefined2 local_348a;
  byte local_3488 [20];
  undefined2 auStack_3474 [42];
  float local_3420 [4];
  float afStack_3410 [10];
  undefined1 local_33e8 [20];
  undefined1 local_33d4 [2228];
  undefined1 local_2b20 [16];
  float afStack_2b10 [572];
  float local_2220 [40];
  float local_2180 [2112];
  undefined1 local_80 [39];
  byte local_59 [41];
  
  bVar45 = 0;
  uVar67 = 0;
  local_4380 = (drmp3d_sample_t *)pcm;
  local_4370 = info;
  if ((4 < mp3_bytes) && (uVar67 = 0, dec->header[0] == 0xff)) {
    iVar47 = drmp3_hdr_compare(dec->header,mp3);
    uVar67 = 0;
    if (iVar47 != 0) {
      iVar47 = drmp3_hdr_frame_bytes(mp3,dec->free_format_bytes);
      iVar61 = 0;
      if ((mp3[2] & 2) != 0) {
        iVar61 = (uint)((~mp3[1] & 6) == 0) * 3 + 1;
      }
      uVar46 = iVar61 + iVar47;
      uVar67 = (ulong)uVar46;
      if ((uVar46 != mp3_bytes) &&
         ((mp3_bytes < (int)(uVar46 + 4) ||
          (iVar47 = drmp3_hdr_compare(mp3,mp3 + (int)uVar46), iVar47 == 0)))) {
        uVar67 = 0;
      }
    }
  }
  local_43a8._0_4_ = 0;
  local_43d0._0_4_ = (int)uVar67;
  local_4378 = mp3;
  if ((int)local_43d0 == 0) {
    local_43d0._0_4_ = 0;
    memset(dec,0,0x1a0c);
    local_43a8._0_4_ = 0;
    if (4 < mp3_bytes) {
      uVar46 = mp3_bytes - 4;
      local_43a8 = (drmp3_uint8 *)(ulong)uVar46;
      puVar89 = local_4378 + 4;
      pdVar72 = (drmp3_uint8 *)0x0;
      h = local_4378;
      local_43d0 = uVar67;
      local_4368 = local_43a8;
      local_4360 = (ulong)(uint)mp3_bytes;
      do {
        iVar47 = drmp3_hdr_valid(h);
        if (iVar47 != 0) {
          iVar47 = drmp3_hdr_frame_bytes(h,dec->free_format_bytes);
          iVar61 = 0;
          if ((h[2] & 2) != 0) {
            iVar61 = (uint)((~h[1] & 6) == 0) * 3 + 1;
          }
          local_43f0 = (ulong)(uint)(iVar61 + iVar47);
          bVar98 = iVar47 == 0;
          if ((bVar98) && (bVar98 = true, (int)pdVar72 + 8 < (int)uVar46)) {
            iVar61 = 4;
            lVar71 = 0;
            pdVar88 = pdVar72;
            puVar92 = puVar89;
            do {
              iVar47 = drmp3_hdr_compare(h,h + lVar71 + 4);
              iVar69 = (int)pdVar88;
              if (iVar47 == 0) {
LAB_00104531:
                iVar47 = 0;
              }
              else {
                iVar47 = 0;
                uVar85 = 0;
                if ((h[2] & 2) != 0) {
                  uVar85 = -(uint)((~h[1] & 6) != 0) | 0xfffffffc;
                }
                if ((h[lVar71 + 6] & 2) != 0) {
                  iVar47 = (uint)((~h[lVar71 + 5] & 6) == 0) * 3 + 1;
                }
                if (mp3_bytes < (int)(iVar47 + uVar85 + iVar69 + 0xc)) goto LAB_00104531;
                iVar48 = drmp3_hdr_compare(h,puVar92 + (iVar47 + uVar85 + iVar61));
                iVar47 = 0;
                if (iVar48 != 0) {
                  iVar47 = uVar85 + (int)lVar71 + 4;
                  dec->free_format_bytes = iVar47;
                  local_43f0 = lVar71 + 4U & 0xffffffff;
                }
              }
              bVar98 = iVar47 == 0;
              if ((0x8fe < lVar71 + 4U) || (iVar47 != 0)) break;
              puVar92 = puVar92 + 1;
              iVar61 = iVar61 + 1;
              lVar71 = lVar71 + 1;
              pdVar88 = pdVar88 + 2;
            } while (iVar69 + 10 < (int)uVar46);
          }
          if ((bVar98) || (mp3_bytes < (int)pdVar72 + (int)local_43f0)) {
LAB_00104634:
            if ((pdVar72 == (drmp3_uint8 *)0x0) && ((int)local_43f0 == mp3_bytes)) {
              bVar98 = false;
              local_43d0 = local_43f0;
              local_43a8 = (drmp3_uint8 *)0x0;
            }
            else {
              dec->free_format_bytes = 0;
              bVar98 = true;
            }
          }
          else {
            lVar71 = local_4360 - (long)pdVar72;
            iVar69 = 0;
            iVar61 = 0;
            do {
              iVar48 = drmp3_hdr_frame_bytes(h + iVar61,iVar47);
              iVar49 = 0;
              if ((h[(long)iVar61 + 2] & 2) != 0) {
                iVar49 = (uint)((~(h + iVar61)[1] & 6) == 0) * 3 + 1;
              }
              if (lVar71 < iVar49 + iVar48 + iVar61 + 4) {
                if (iVar69 == 0) goto LAB_00104634;
                break;
              }
              iVar61 = iVar48 + iVar61 + iVar49;
              iVar48 = drmp3_hdr_compare(h,h + iVar61);
              if (iVar48 == 0) goto LAB_00104634;
              iVar69 = iVar69 + -1;
            } while (iVar69 != -10);
            bVar98 = false;
            local_43d0 = local_43f0;
            local_43a8 = (drmp3_uint8 *)((ulong)pdVar72 & 0xffffffff);
          }
          if (!bVar98) goto LAB_001046a6;
        }
        pdVar72 = pdVar72 + 1;
        h = h + 1;
        puVar89 = puVar89 + 1;
      } while (pdVar72 != local_4368);
      local_43d0._0_4_ = 0;
      local_43a8._0_4_ = uVar46;
    }
LAB_001046a6:
    if (((int)local_43d0 == 0) || (mp3_bytes < (int)((uint)local_43a8 + (int)local_43d0))) {
      local_4370->frame_bytes = (uint)local_43a8;
      return 0;
    }
  }
  puVar89 = local_4378 + (int)(uint)local_43a8;
  local_4398.buf = puVar89 + 4;
  *(undefined4 *)dec->header = *(undefined4 *)puVar89;
  local_4370->frame_bytes = (uint)local_43a8 + (int)local_43d0;
  local_4370->channels = (puVar89[3] < 0xc0) + 1;
  local_4370->hz =
       (*(uint *)(drmp3_hdr_sample_rate_hz_g_hz + (puVar89[2] & 0xc)) >> ((puVar89[1] & 8) == 0)) >>
       ((puVar89[1] & 0x10) == 0);
  uVar46 = puVar89[1] >> 1 & 3;
  local_4370->layer = 4 - uVar46;
  local_4370->bitrate_kbps =
       (uint)(byte)drmp3_hdr_bitrate_kbps_halfrate
                   [(ulong)(puVar89[2] >> 4) +
                    (long)(int)((puVar89[1] >> 1 & 3) - 1) * 0xf +
                    (ulong)(puVar89[1] >> 3 & 1) * 0x2d] * 2;
  local_4398.pos = 0;
  local_4398.limit = (int)local_43d0 * 8 + -0x20;
  bVar79 = puVar89[1];
  if ((bVar79 & 1) == 0) {
    drmp3_bs_get_bits(&local_4398,0x10);
  }
  puVar89 = local_4378 + (int)(uint)local_43a8;
  if ((char)uVar46 == '\x01') {
    iVar47 = ((bVar79 >> 3 & 1) + (uint)((bVar79 >> 4 & 1) != 0)) * 3 + (puVar89[2] >> 2 & 3);
    dVar52 = 0;
    uVar46 = (puVar89[3] < 0xc0) + 1;
    if ((bVar79 & 8) == 0) {
      dVar50 = drmp3_bs_get_bits(&local_4398,uVar46 | 8);
      uVar51 = dVar50 >> (sbyte)uVar46;
      uVar85 = uVar46;
    }
    else {
      uVar85 = uVar46 * 2;
      uVar51 = drmp3_bs_get_bits(&local_4398,9);
      dVar52 = drmp3_bs_get_bits(&local_4398,uVar46 * 2 + 7);
    }
    lVar54 = (long)(int)(iVar47 + -1 + (uint)(iVar47 == 0));
    lVar71 = lVar54 * 0x28;
    bVar79 = puVar89[3];
    iVar47 = 0;
    pbVar90 = local_3488 + 7;
    local_4378 = puVar89;
    do {
      uVar46 = dVar52 << 4;
      if (bVar79 < 0xc0) {
        uVar46 = dVar52;
      }
      uVar67 = (ulong)uVar46;
      dVar52 = drmp3_bs_get_bits(&local_4398,0xc);
      *(short *)(pbVar90 + -0x17) = (short)dVar52;
      dVar50 = drmp3_bs_get_bits(&local_4398,9);
      *(short *)(pbVar90 + -0x15) = (short)dVar50;
      uVar70 = 0xffffffff;
      if (0x120 < (dVar50 & 0xffff)) goto LAB_00104b5b;
      dVar50 = drmp3_bs_get_bits(&local_4398,8);
      pbVar90[-0x11] = (byte)dVar50;
      bVar97 = local_4378[1];
      dVar50 = drmp3_bs_get_bits(&local_4398,(uint)((bVar97 & 8) == 0) * 5 + 4);
      *(short *)(pbVar90 + -0x13) = (short)dVar50;
      *(undefined1 **)(pbVar90 + -0x1f) = drmp3_L3_read_side_info_g_scf_long + lVar54 * 0x17;
      pbVar90[-0xe] = 0x16;
      pbVar90[-0xd] = 0;
      dVar50 = drmp3_bs_get_bits(&local_4398,1);
      if (dVar50 == 0) {
        pbVar90[-0x10] = 0;
        pbVar90[-0xf] = 0;
        dVar50 = drmp3_bs_get_bits(&local_4398,0xf);
        dVar53 = drmp3_bs_get_bits(&local_4398,4);
        pbVar90[-9] = (byte)dVar53;
        dVar53 = drmp3_bs_get_bits(&local_4398,3);
        pbVar90[-8] = (byte)dVar53;
        pbVar90[-7] = 0xff;
      }
      else {
        dVar50 = drmp3_bs_get_bits(&local_4398,2);
        pbVar90[-0x10] = (byte)dVar50;
        if ((byte)dVar50 == 0) goto LAB_00104b5b;
        dVar50 = drmp3_bs_get_bits(&local_4398,1);
        pbVar90[-0xf] = (byte)dVar50;
        pbVar90[-9] = 7;
        pbVar90[-8] = 0xff;
        if (pbVar90[-0x10] == 2) {
          if ((byte)dVar50 == 0) {
            pbVar90[-9] = 8;
            *(undefined1 **)(pbVar90 + -0x1f) = drmp3_L3_read_side_info_g_scf_short + lVar71;
            bVar59 = 0x27;
            bVar44 = 0;
          }
          else {
            *(undefined1 **)(pbVar90 + -0x1f) = drmp3_L3_read_side_info_g_scf_mixed + lVar71;
            bVar44 = ((bVar97 & 8) >> 2) + 6;
            bVar59 = 0x1e;
          }
          uVar67 = (ulong)(uVar46 & 0xf0f);
          pbVar90[-0xe] = bVar44;
          pbVar90[-0xd] = bVar59;
        }
        dVar50 = drmp3_bs_get_bits(&local_4398,10);
        dVar50 = dVar50 << 5;
        dVar53 = drmp3_bs_get_bits(&local_4398,3);
        pbVar90[-6] = (byte)dVar53;
        dVar53 = drmp3_bs_get_bits(&local_4398,3);
        pbVar90[-5] = (byte)dVar53;
        dVar53 = drmp3_bs_get_bits(&local_4398,3);
        pbVar90[-4] = (byte)dVar53;
      }
      pbVar90[-0xc] = (byte)(dVar50 >> 10);
      pbVar90[-0xb] = (byte)(dVar50 >> 5) & 0x1f;
      pbVar90[-10] = (byte)dVar50 & 0x1f;
      if ((bVar97 & 8) == 0) {
        bVar97 = 499 < *(ushort *)(pbVar90 + -0x13);
      }
      else {
        dVar50 = drmp3_bs_get_bits(&local_4398,1);
        bVar97 = (byte)dVar50;
      }
      iVar47 = iVar47 + (dVar52 & 0xffff);
      pbVar90[-3] = bVar97;
      dVar52 = drmp3_bs_get_bits(&local_4398,1);
      pbVar90[-2] = (byte)dVar52;
      dVar52 = drmp3_bs_get_bits(&local_4398,1);
      pbVar90[-1] = (byte)dVar52;
      *pbVar90 = (byte)(uVar67 >> 0xc) & 0xf;
      dVar52 = (int)uVar67 << 4;
      pbVar90 = pbVar90 + 0x20;
      uVar85 = uVar85 - 1;
    } while (uVar85 != 0);
    uVar70 = 0xffffffff;
    if (iVar47 + local_4398.pos <= (int)(uVar51 * 8 + local_4398.limit)) {
      uVar70 = uVar51;
    }
LAB_00104b5b:
    iVar47 = local_4398.pos;
    if (((int)uVar70 < 0) ||
       (iVar61 = local_4398.limit - local_4398.pos, local_4398.limit < local_4398.pos)) {
      dec->header[0] = '\0';
      uVar46 = 1;
      bVar98 = false;
    }
    else {
      uVar46 = dec->reserv;
      uVar85 = uVar70;
      if ((int)uVar46 < (int)uVar70) {
        uVar85 = uVar46;
      }
      uVar51 = 0;
      if (0 < (int)(uVar46 - uVar70)) {
        uVar51 = uVar46 - uVar70;
      }
      iVar69 = iVar61 + 7;
      if (-1 < iVar61) {
        iVar69 = iVar61;
      }
      memcpy(local_3fa0,dec->reserv_buf + uVar51,(long)(int)uVar85);
      iVar61 = iVar47 + 7;
      if (-1 < iVar47) {
        iVar61 = iVar47;
      }
      memcpy(local_3fa0 + (int)uVar85,local_4398.buf + (iVar61 >> 3),(long)(iVar69 >> 3));
      local_3fb0.pos = 0;
      local_3fb0.limit = ((iVar69 >> 3) + uVar85) * 8;
      local_3fb0.buf = local_3fa0;
      if ((local_4380 != (drmp3d_sample_t *)0x0) && ((int)uVar70 <= (int)uVar46)) {
        local_4350 = dec->qmf_state;
        uVar67 = 0;
        pdVar93 = local_4370;
        pdVar96 = local_4380;
        do {
          local_4380 = pdVar96;
          memset(local_3420,0,0x1200);
          iVar47 = pdVar93->channels;
          local_4348 = uVar67;
          lVar71 = (long)(iVar47 * (int)uVar67);
          lVar54 = lVar71 * 0x20;
          plVar74 = &local_34a0 + lVar71 * 4;
          local_4358 = (long)iVar47;
          auVar131._0_12_ = ZEXT812(0x3f800000);
          auVar131._12_4_ = 0;
          if (0 < (long)iVar47) {
            uVar67 = 0;
            do {
              lVar55 = uVar67 * 0x20;
              plVar1 = plVar74 + uVar67 * 4;
              uVar8 = local_3498[lVar71 * 0x10 + uVar67 * 0x10];
              local_43e0 = drmp3_L3_decode_scalefactors_g_scf_partitions +
                           (((ulong)(local_348f[lVar55 + lVar54] == 0) + 1) -
                           (ulong)(local_348f[lVar55 + lVar54 + 1] == 0)) * 0x1c;
              bVar79 = local_3488[lVar55 + lVar54 + 5];
              if ((dec->header[1] & 8) == 0) {
                bVar97 = (dec->header[3] & 0x10) >> 4 & uVar67 != 0;
                uVar85 = (uint)(*(ushort *)((long)plVar1 + 0xc) >> bVar97);
                uVar63 = 0;
                if (bVar97 != 0) {
                  uVar63 = 0xc;
                }
                puVar80 = drmp3_L3_decode_scalefactors_g_mod + uVar63;
                do {
                  uVar81 = 1;
                  lVar55 = 3;
                  do {
                    bVar97 = puVar80[lVar55];
                    local_439c[lVar55] = (byte)((uVar85 / uVar81) % (ulong)bVar97);
                    uVar51 = (int)uVar81 * (uint)bVar97;
                    uVar81 = (ulong)uVar51;
                    bVar98 = lVar55 != 0;
                    lVar55 = lVar55 + -1;
                  } while (bVar98);
                  uVar63 = uVar63 + 4;
                  puVar80 = puVar80 + 4;
                  uVar85 = uVar85 - uVar51;
                } while (-1 < (int)uVar85);
                local_43e0 = local_43e0 + (uVar63 & 0xffffffff);
                uVar85 = 0xfffffff0;
              }
              else {
                uVar85 = (uint)*(byte *)((long)plVar1 + 0x1f);
                local_439c[0] =
                     (byte)drmp3_L3_decode_scalefactors_g_scfc_decode
                           [*(ushort *)((long)plVar1 + 0xc)] >> 2;
                local_439c[1] = local_439c[0];
                local_439c[2] =
                     drmp3_L3_decode_scalefactors_g_scfc_decode[*(ushort *)((long)plVar1 + 0xc)] & 3
                ;
                local_439c[3] = local_439c[2];
              }
              __dest = &local_4338;
              local_4340 = (long)local_3fb0.pos + (ulong)uVar8;
              local_4360 = uVar67;
              puVar80 = local_80 + uVar67 * 0x27;
              lVar55 = 0;
              do {
                uVar67 = (ulong)(byte)local_43e0[lVar55];
                if (uVar67 == 0) break;
                if ((uVar85 & 8) == 0) {
                  bVar97 = local_439c[lVar55];
                  if (bVar97 == 0) {
                    memset(__dest,0,uVar67);
                    memset(puVar80,0,uVar67);
                  }
                  else {
                    dVar52 = ~(-1 << (bVar97 & 0x1f));
                    if (-1 < (int)uVar85) {
                      dVar52 = 0xffffffff;
                    }
                    uVar63 = 0;
                    do {
                      dVar50 = drmp3_bs_get_bits(&local_3fb0,(uint)bVar97);
                      uVar60 = (char)dVar50;
                      if (dVar50 == dVar52) {
                        uVar60 = 0xff;
                      }
                      *(char *)((long)__dest + uVar63) = (char)dVar50;
                      puVar80[uVar63] = uVar60;
                      uVar63 = uVar63 + 1;
                    } while (uVar67 != uVar63);
                  }
                }
                else {
                  memcpy(__dest,puVar80,uVar67);
                }
                puVar80 = puVar80 + uVar67;
                __dest = (undefined4 *)((long)__dest + uVar67);
                lVar55 = lVar55 + 1;
                uVar85 = uVar85 * 2;
                auVar131._0_12_ = ZEXT812(0x3f800000);
                auVar131._12_4_ = 0;
              } while (lVar55 != 4);
              *(undefined1 *)((long)__dest + 2) = 0;
              *(undefined2 *)__dest = 0;
              bVar97 = *(byte *)((long)plVar1 + 0x12);
              if ((ulong)bVar97 == 0) {
                if (*(char *)((long)plVar1 + 0x1c) != '\0') {
                  lVar55 = 0;
                  do {
                    pcVar2 = (char *)((long)&local_4330 + lVar55 + 3);
                    *pcVar2 = *pcVar2 + (&drmp3_L3_decode_scalefactors_g_preamp)[lVar55];
                    lVar55 = lVar55 + 1;
                  } while (lVar55 != 10);
                }
              }
              else {
                cVar4 = *(char *)((long)plVar1 + 0x19);
                bVar44 = 2 - bVar79;
                cVar5 = *(char *)((long)plVar1 + 0x1a);
                uVar63 = (ulong)*(byte *)((long)plVar1 + 0x11);
                cVar6 = *(char *)((long)plVar1 + 0x1b);
                uVar67 = 0;
                do {
                  pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar63);
                  *pcVar2 = *pcVar2 + (cVar4 << (bVar44 & 0x1f));
                  pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar63 + 1);
                  *pcVar2 = *pcVar2 + (cVar5 << (bVar44 & 0x1f));
                  pcVar2 = (char *)((long)&local_4338 + uVar67 + uVar63 + 2);
                  *pcVar2 = *pcVar2 + (cVar6 << (bVar44 & 0x1f));
                  uVar67 = uVar67 + 3;
                } while (uVar67 < bVar97);
              }
              fVar99 = 2048.0;
              uVar85 = ((uint)((dec->header[3] & 0xe0) == 0x60) * 2 -
                       (uint)*(byte *)((long)plVar1 + 0xe)) + 0x102;
              do {
                uVar51 = 0x78;
                if ((int)uVar85 < 0x78) {
                  uVar51 = uVar85;
                }
                fVar99 = fVar99 * (float)(int)(0x40000000 >> ((byte)(uVar51 >> 2) & 0x1f)) *
                                  (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar51 & 3];
                uVar65 = uVar85 - uVar51;
                bVar98 = (int)uVar51 <= (int)uVar85;
                uVar85 = uVar65;
              } while (uVar65 != 0 && bVar98);
              uVar85 = (uint)bVar97 + (uint)*(byte *)((long)plVar1 + 0x11);
              if (uVar85 != 0) {
                uVar67 = 0;
                do {
                  uVar51 = (uint)*(byte *)((long)&local_4338 + uVar67) << (bVar79 + 1 & 0x1f);
                  fVar102 = fVar99;
                  do {
                    uVar63 = 0x78;
                    if ((int)uVar51 < 0x78) {
                      uVar63 = (ulong)uVar51;
                    }
                    uVar84 = (uint)uVar63;
                    fVar102 = fVar102 * (float)(int)(0x40000000 >> ((byte)(uVar63 >> 2) & 0x1f)) *
                                        (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar84 & 3];
                    uVar65 = uVar51 - uVar84;
                    bVar98 = (int)uVar84 <= (int)uVar51;
                    uVar51 = uVar65;
                  } while (uVar65 != 0 && bVar98);
                  local_2220[uVar67] = fVar102;
                  uVar67 = uVar67 + 1;
                } while (uVar67 != uVar85);
              }
              pfVar68 = local_3420 + local_4360 * 0x240;
              uVar85 = local_3fb0.pos + 7;
              if (-1 < local_3fb0.pos) {
                uVar85 = local_3fb0.pos;
              }
              local_4368 = local_3fb0.buf;
              puVar82 = (uint *)((long)(local_3fb0.buf + ((int)uVar85 >> 3)) + 4);
              uVar85 = *(uint *)(local_3fb0.buf + ((int)uVar85 >> 3));
              uVar67 = (ulong)((uVar85 >> 0x18 | (uVar85 & 0xff0000) >> 8 | (uVar85 & 0xff00) << 8 |
                               uVar85 << 0x18) << ((byte)local_3fb0.pos & 7));
              uVar51 = (uint)*(ushort *)((long)plVar1 + 10);
              uVar85 = local_3fb0.pos | 0xfffffff8;
              pbVar90 = (byte *)*plVar1;
              if (*(ushort *)((long)plVar1 + 10) == 0) {
                auVar100._0_12_ = ZEXT812(0);
                auVar100._12_4_ = 0;
                pfVar58 = local_2220;
              }
              else {
                lVar55 = 0;
                pfVar58 = local_2220;
                do {
                  bVar79 = *(byte *)((long)plVar1 + lVar55 + 0x13);
                  sVar9 = *(short *)(drmp3_L3_huffman_tabindex + (ulong)bVar79 * 2);
                  bVar97 = drmp3_L3_huffman_g_linbits[bVar79];
                  uVar84 = uVar51;
                  uVar65 = (uint)*(byte *)((long)plVar1 + lVar55 + 0x16);
                  do {
                    uVar62 = (uint)(*pbVar90 >> 1);
                    uVar51 = uVar62;
                    if ((int)uVar84 < (int)uVar62) {
                      uVar51 = uVar84;
                    }
                    fVar99 = *pfVar58;
                    auVar100 = ZEXT416((uint)fVar99);
                    do {
                      uVar83 = (uint)uVar67;
                      sVar10 = *(short *)(drmp3_L3_huffman_tabs +
                                         (uVar67 >> 0x1b) * 2 + (long)sVar9 * 2);
                      uVar95 = (uint)sVar10;
                      if (sVar10 < 0) {
                        uVar77 = 5;
                        do {
                          uVar83 = (int)uVar67 << (sbyte)uVar77;
                          uVar67 = (ulong)uVar83;
                          uVar85 = uVar85 + uVar77;
                          uVar77 = uVar95 & 7;
                          sVar10 = *(short *)(drmp3_L3_huffman_tabs +
                                             (ulong)((uVar83 >> (-(char)uVar77 & 0x1fU)) -
                                                    ((int)uVar95 >> 3)) * 2 + (long)sVar9 * 2);
                          uVar95 = (uint)sVar10;
                        } while (sVar10 < 0);
                      }
                      uVar67 = (ulong)(uVar83 << ((byte)(uVar95 >> 8) & 0x1f));
                      uVar85 = (uVar95 >> 8) + uVar85;
                      iVar47 = 0;
                      do {
                        uVar83 = uVar95 & 0xf;
                        uVar77 = (uint)uVar67;
                        if (((bVar79 & 0xf0) == 0x10) && (uVar83 == 0xf)) {
                          uVar86 = uVar77 >> (0x20 - bVar97 & 0x1f);
                          uVar77 = uVar77 << (bVar97 & 0x1f);
                          uVar85 = uVar85 + bVar97;
                          uVar83 = uVar85;
                          if (-1 < (int)uVar85) {
                            do {
                              uVar85 = *puVar82;
                              puVar82 = (uint *)((long)puVar82 + 1);
                              uVar77 = uVar77 | (uint)(byte)uVar85 << ((byte)uVar83 & 0x1f);
                              uVar85 = uVar83 - 8;
                              bVar98 = 7 < (int)uVar83;
                              uVar83 = uVar85;
                            } while (bVar98);
                          }
                          uVar83 = uVar86 + 0xf;
                          if ((int)uVar83 < 0x81) {
                            fVar102 = g_drmp3_pow43[(int)(uVar86 + 0x1f)];
                          }
                          else {
                            uVar87 = uVar83 * 8;
                            if (SBORROW4(uVar83,0x400) == (int)(uVar86 - 0x3f1) < 0) {
                              uVar87 = uVar83;
                            }
                            uVar86 = uVar87 * 2 & 0x40;
                            fVar102 = (float)(int)((uVar87 & 0x3f) - uVar86) /
                                      (float)(int)((uVar87 & 0x7fffffc0) + uVar86);
                            fVar102 = ((fVar102 * 0.22222222 + 1.3333334) * fVar102 + auVar131._0_4_
                                      ) * g_drmp3_pow43[(ulong)(uVar86 + uVar87 >> 6) + 0x10] *
                                      *(float *)(&DAT_001122a8 + (ulong)((int)uVar83 < 0x400) * 4);
                          }
                          fVar102 = (float)(int)((int)uVar77 >> 0x1f | 1) * fVar102 * fVar99;
                        }
                        else {
                          fVar102 = g_drmp3_pow43[((uint)(uVar67 >> 0x1b) & 0x10 | uVar83) ^ 0x10] *
                                    fVar99;
                        }
                        uVar67 = (ulong)(uVar77 << (uVar83 != 0));
                        *pfVar68 = fVar102;
                        uVar85 = uVar85 + (uVar83 != 0);
                        pfVar68 = pfVar68 + 1;
                        uVar95 = uVar95 >> 4;
                        bVar98 = iVar47 == 0;
                        iVar47 = iVar47 + 1;
                      } while (bVar98);
                      uVar83 = uVar85;
                      if (-1 < (int)uVar85) {
                        do {
                          uVar85 = *puVar82;
                          puVar82 = (uint *)((long)puVar82 + 1);
                          uVar67 = (ulong)((uint)uVar67 |
                                          (uint)(byte)uVar85 << ((byte)uVar83 & 0x1f));
                          uVar85 = uVar83 - 8;
                          bVar98 = 7 < (int)uVar83;
                          uVar83 = uVar85;
                        } while (bVar98);
                      }
                      uVar51 = uVar51 - 1;
                    } while (uVar51 != 0);
                    pbVar90 = pbVar90 + 1;
                    pfVar58 = pfVar58 + 1;
                    uVar51 = uVar84 - uVar62;
                  } while ((uVar51 != 0 && (int)uVar62 <= (int)uVar84) &&
                          (bVar98 = 0 < (int)uVar65, uVar84 = uVar51, uVar65 = uVar65 - 1, bVar98));
                  lVar55 = lVar55 + 1;
                } while (0 < (int)uVar51);
              }
              uVar51 = 1 - uVar51;
              puVar80 = drmp3_L3_huffman_tab33;
              if (*(char *)((long)plVar1 + 0x1e) == '\0') {
                puVar80 = drmp3_L3_huffman_tab32;
              }
              do {
                bVar79 = puVar80[uVar67 >> 0x1c];
                if ((bVar79 & 8) == 0) {
                  bVar79 = puVar80[(ulong)((uint)((int)uVar67 << 4) >> (-(bVar79 & 3) & 0x1f)) +
                                   (ulong)(bVar79 >> 3)];
                }
                uVar65 = bVar79 & 7;
                uVar84 = (int)uVar67 << (sbyte)uVar65;
                uVar67 = (ulong)uVar84;
                uVar85 = uVar65 + uVar85;
                if (local_4340 <
                    (long)(int)uVar85 + ((long)puVar82 - (long)local_3fb0.buf) * 8 + -0x18) {
LAB_00105463:
                  bVar98 = false;
                }
                else {
                  uVar51 = uVar51 - 1;
                  if (uVar51 == 0) {
                    bVar97 = *pbVar90;
                    pbVar90 = pbVar90 + 1;
                    uVar51 = 0;
                    if (bVar97 < 2) goto LAB_00105463;
                    auVar100 = ZEXT416((uint)*pfVar58);
                    pfVar58 = pfVar58 + 1;
                    uVar51 = (uint)(bVar97 >> 1);
                  }
                  if (0x7f < bVar79) {
                    auVar104 = auVar100;
                    if ((int)uVar84 < 0) {
                      auVar104._0_4_ = auVar100._0_4_ ^ 0x80000000;
                      auVar104._4_4_ = 0;
                      auVar104._8_4_ = auVar100._8_4_ ^ 0x80000000;
                      auVar104._12_4_ = auVar100._12_4_ ^ 0x80000000;
                    }
                    *pfVar68 = auVar104._0_4_;
                    uVar67 = (ulong)(uVar84 * 2);
                    uVar85 = uVar85 + 1;
                  }
                  if ((bVar79 & 0x40) != 0) {
                    auVar105 = auVar100;
                    if ((int)uVar67 < 0) {
                      auVar105._0_4_ = auVar100._0_4_ ^ 0x80000000;
                      auVar105._4_4_ = 0;
                      auVar105._8_4_ = auVar100._8_4_ ^ 0x80000000;
                      auVar105._12_4_ = auVar100._12_4_ ^ 0x80000000;
                    }
                    pfVar68[1] = auVar105._0_4_;
                    uVar67 = (ulong)(uint)((int)uVar67 * 2);
                    uVar85 = uVar85 + 1;
                  }
                  uVar51 = uVar51 - 1;
                  if (uVar51 == 0) {
                    bVar97 = *pbVar90;
                    pbVar90 = pbVar90 + 1;
                    uVar51 = 0;
                    if (bVar97 < 2) goto LAB_00105463;
                    auVar100 = ZEXT416((uint)*pfVar58);
                    pfVar58 = pfVar58 + 1;
                    uVar51 = (uint)(bVar97 >> 1);
                  }
                  if ((bVar79 & 0x20) != 0) {
                    auVar106 = auVar100;
                    if ((int)uVar67 < 0) {
                      auVar106._0_4_ = auVar100._0_4_ ^ 0x80000000;
                      auVar106._4_4_ = 0;
                      auVar106._8_4_ = auVar100._8_4_ ^ 0x80000000;
                      auVar106._12_4_ = auVar100._12_4_ ^ 0x80000000;
                    }
                    pfVar68[2] = auVar106._0_4_;
                    uVar67 = (ulong)(uint)((int)uVar67 * 2);
                    uVar85 = uVar85 + 1;
                  }
                  if ((bVar79 & 0x10) != 0) {
                    auVar107 = auVar100;
                    if ((int)uVar67 < 0) {
                      auVar107._0_4_ = auVar100._0_4_ ^ 0x80000000;
                      auVar107._4_4_ = 0;
                      auVar107._8_4_ = auVar100._8_4_ ^ 0x80000000;
                      auVar107._12_4_ = auVar100._12_4_ ^ 0x80000000;
                    }
                    pfVar68[3] = auVar107._0_4_;
                    uVar67 = (ulong)(uint)((int)uVar67 * 2);
                    uVar85 = uVar85 + 1;
                  }
                  bVar98 = true;
                  uVar65 = uVar85;
                  if (-1 < (int)uVar85) {
                    do {
                      uVar85 = *puVar82;
                      puVar82 = (uint *)((long)puVar82 + 1);
                      uVar67 = (ulong)((uint)uVar67 | (uint)(byte)uVar85 << ((byte)uVar65 & 0x1f));
                      uVar85 = uVar65 - 8;
                      bVar12 = 7 < (int)uVar65;
                      uVar65 = uVar85;
                    } while (bVar12);
                  }
                }
                pfVar68 = pfVar68 + 4;
              } while (bVar98);
              local_3fb0.pos = (uint)local_4340;
              uVar67 = local_4360 + 1;
            } while (uVar67 != local_4358);
          }
          bVar79 = dec->header[3];
          if ((bVar79 & 0x10) == 0) {
            if ((bVar79 & 0xe0) == 0x60) {
              uVar67 = 0xfffffffffffffffc;
              do {
                fVar99 = afStack_3410[uVar67];
                fVar102 = afStack_3410[uVar67 + 1];
                fVar103 = afStack_3410[uVar67 + 2];
                fVar34 = afStack_3410[uVar67 + 3];
                auVar101 = *(undefined1 (*) [16])(afStack_2b10 + uVar67);
                auVar120._0_4_ = fVar99 + auVar101._0_4_;
                auVar120._4_4_ = fVar102 + auVar101._4_4_;
                auVar120._8_4_ = fVar103 + auVar101._8_4_;
                auVar120._12_4_ = fVar34 + auVar101._12_4_;
                *(undefined1 (*) [16])(afStack_3410 + uVar67) = auVar120;
                afStack_2b10[uVar67] = fVar99 - auVar101._0_4_;
                afStack_2b10[uVar67 + 1] = fVar102 - auVar101._4_4_;
                afStack_2b10[uVar67 + 2] = fVar103 - auVar101._8_4_;
                local_2220[uVar67 - 0x239] = fVar34 - auVar101._12_4_;
                uVar67 = uVar67 + 4;
              } while (uVar67 < 0x239);
            }
          }
          else {
            bVar97 = local_348f[lVar54];
            bVar44 = local_348f[lVar54 + 1];
            lVar54 = *plVar74;
            local_4330 = -NAN;
            _local_4338 = 0xffffffffffffffff;
            uVar85 = (uint)bVar44 + (uint)bVar97;
            if (uVar85 != 0) {
              uVar67 = 0;
              puVar80 = local_2b20;
              do {
                uVar63 = (ulong)*(byte *)(lVar54 + uVar67);
                if (uVar63 != 0) {
                  uVar81 = 0;
                  do {
                    if (((*(float *)(puVar80 + uVar81 * 4) != 0.0) ||
                        (*(float *)(puVar80 + uVar81 * 4 + 4) != 0.0)) ||
                       (NAN(*(float *)(puVar80 + uVar81 * 4 + 4)))) {
                      (&local_4338)[(uint)((int)uVar67 + (int)((uVar67 & 0xffffffff) / 3) * -3)] =
                           (int)uVar67;
                      break;
                    }
                    uVar81 = uVar81 + 2;
                  } while (uVar81 < uVar63);
                }
                puVar80 = puVar80 + uVar63 * 4;
                uVar67 = uVar67 + 1;
              } while (uVar67 != uVar85);
            }
            if (bVar97 != 0) {
              if ((int)fStack_4334 < (int)local_4338) {
                fStack_4334 = local_4338;
              }
              if ((int)fStack_4334 <= (int)local_4330) {
                fStack_4334 = local_4330;
              }
              local_4330 = fStack_4334;
              _local_4338 = CONCAT44(fStack_4334,fStack_4334);
            }
            uVar51 = (uint)(bVar44 != 0) * 2 + 1;
            lVar54 = (long)(int)(uVar85 - uVar51) + -0x59;
            uVar67 = 0;
            do {
              if ((int)(&local_4338)[uVar67] < (int)(uVar85 + uVar51 * -2 + (int)uVar67)) {
                bVar97 = local_59[uVar67 + (lVar54 - (ulong)uVar51) + 0x59];
              }
              else {
                bVar97 = (char)(dec->header[1] << 4) >> 7 & 3;
              }
              local_59[uVar67 + lVar54 + 0x59] = bVar97;
              uVar67 = uVar67 + 1;
            } while (uVar67 != uVar51);
            pbVar90 = (byte *)*plVar74;
            bVar97 = dec->header[1];
            bVar44 = 7;
            if ((bVar97 & 8) == 0) {
              bVar44 = 0x40;
            }
            bVar59 = *pbVar90;
            if (bVar59 != 0) {
              uVar11 = auStack_3474[lVar71 * 0x10];
              fVar99 = *(float *)(&DAT_001122b0 + (ulong)((bVar79 & 0x20) == 0) * 4);
              uVar67 = 0;
              pfVar68 = local_3420;
              do {
                iVar47 = (int)uVar67;
                if ((int)(&local_4338)[(uint)(iVar47 + (int)(uVar67 / 3) * -3)] < iVar47) {
                  bVar7 = local_59[uVar67];
                  if (bVar44 <= bVar7) goto LAB_00105827;
                  if ((bVar97 & 8) == 0) {
                    auVar108 = auVar131;
                    uVar85 = (bVar7 + 1 >> 1) << ((byte)uVar11 & 1);
                    do {
                      auVar101 = auVar108;
                      uVar51 = 0x78;
                      if ((int)uVar85 < 0x78) {
                        uVar51 = uVar85;
                      }
                      auVar108._4_12_ = auVar101._4_12_;
                      auVar108._0_4_ =
                           auVar101._0_4_ *
                           (float)(int)(0x40000000 >> ((byte)(uVar51 >> 2) & 0x1f)) *
                           (float)(&drmp3_L3_ldexp_q2_g_expfrac)[uVar51 & 3];
                      uVar65 = uVar85 - uVar51;
                      bVar98 = (int)uVar51 <= (int)uVar85;
                      uVar85 = uVar65;
                    } while (uVar65 != 0 && bVar98);
                    auVar121 = auVar131;
                    if ((bVar7 & 1) != 0) {
                      auVar121._4_4_ = 0;
                      auVar121._0_4_ = auVar108._0_4_;
                      auVar121._8_4_ = auVar101._8_4_;
                      auVar121._12_4_ = auVar101._12_4_;
                      auVar108 = auVar131;
                    }
                    fVar103 = auVar108._0_4_;
                    fVar102 = auVar121._0_4_;
                  }
                  else {
                    fVar102 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar7 * 8);
                    fVar103 = *(float *)(drmp3_L3_stereo_process_g_pan + (ulong)bVar7 * 8 + 4);
                  }
                  uVar63 = 0;
                  do {
                    pfVar68[uVar63 + 0x240] = fVar103 * fVar99 * pfVar68[uVar63];
                    pfVar68[uVar63] = pfVar68[uVar63] * fVar102 * fVar99;
                    uVar63 = uVar63 + 1;
                  } while (bVar59 != uVar63);
                }
                else {
LAB_00105827:
                  if ((bVar79 & 0x20) != 0) {
                    uVar63 = 0;
                    if (3 < bVar59) {
                      uVar63 = 0;
                      do {
                        pfVar58 = pfVar68 + uVar63;
                        fVar102 = *pfVar58;
                        fVar103 = pfVar58[1];
                        fVar34 = pfVar58[2];
                        fVar35 = pfVar58[3];
                        auVar101 = *(undefined1 (*) [16])(pfVar68 + uVar63 + 0x240);
                        pfVar58 = pfVar68 + uVar63;
                        *pfVar58 = fVar102 + auVar101._0_4_;
                        pfVar58[1] = fVar103 + auVar101._4_4_;
                        pfVar58[2] = fVar34 + auVar101._8_4_;
                        pfVar58[3] = fVar35 + auVar101._12_4_;
                        auVar109._0_4_ = fVar102 - auVar101._0_4_;
                        auVar109._4_4_ = fVar103 - auVar101._4_4_;
                        auVar109._8_4_ = fVar34 - auVar101._8_4_;
                        auVar109._12_4_ = fVar35 - auVar101._12_4_;
                        *(undefined1 (*) [16])(pfVar68 + uVar63 + 0x240) = auVar109;
                        uVar63 = uVar63 + 4;
                      } while ((long)uVar63 < (long)(int)(bVar59 - 3));
                    }
                    if ((int)uVar63 < (int)(uint)bVar59) {
                      uVar63 = uVar63 & 0xffffffff;
                      do {
                        fVar102 = pfVar68[uVar63];
                        pfVar68[uVar63] = fVar102 + pfVar68[uVar63 + 0x240];
                        pfVar68[uVar63 + 0x240] = fVar102 - pfVar68[uVar63 + 0x240];
                        uVar63 = uVar63 + 1;
                      } while (bVar59 != uVar63);
                    }
                  }
                }
                pfVar68 = pfVar68 + pbVar90[uVar67];
                uVar67 = (ulong)(iVar47 + 1);
                bVar59 = pbVar90[uVar67];
              } while (bVar59 != 0);
            }
          }
          pdVar91 = &local_3fb0;
          if (0 < (int)local_4358) {
            puVar80 = local_33d4;
            pauVar73 = (undefined1 (*) [16])local_33e8;
            uVar67 = 0;
            do {
              lVar71 = plVar74[2];
              iVar47 = (uint)((char)lVar71 != '\0') * 2 <<
                       ((byte)(((dec->header[1] >> 3 & 1) + ((dec->header[1] >> 4 & 1) != 0)) *
                               '\x03' + (dec->header[2] >> 2 & 3)) == '\x02');
              if (*(char *)((long)plVar74 + 0x12) == '\0') {
                iVar61 = 0x1f;
              }
              else {
                __dest_00 = (void *)((long)local_3420 +
                                    (ulong)(uint)(iVar47 * 0x48) + uVar67 * 0x900);
                bVar79 = *(byte *)(*plVar74 + (ulong)*(byte *)((long)plVar74 + 0x11));
                pfVar68 = local_2180;
                if (bVar79 != 0) {
                  lVar54 = *plVar74 + (ulong)*(byte *)((long)plVar74 + 0x11);
                  pvVar75 = __dest_00;
                  do {
                    uVar63 = (ulong)bVar79;
                    lVar55 = 0;
                    do {
                      *pfVar68 = *(float *)((long)pvVar75 + lVar55);
                      pfVar68[1] = *(float *)((long)pvVar75 + lVar55 + uVar63 * 4);
                      pfVar68[2] = *(float *)((long)pvVar75 + lVar55 + uVar63 * 8);
                      pfVar68 = pfVar68 + 3;
                      lVar55 = lVar55 + 4;
                    } while (((uint)bVar79 + (uint)(uVar63 == 0)) * 4 != (int)lVar55);
                    pvVar75 = (void *)((long)pvVar75 + lVar55 + uVar63 * 8);
                    bVar79 = *(byte *)(lVar54 + 3);
                    lVar54 = lVar54 + 3;
                  } while (bVar79 != 0);
                }
                iVar61 = iVar47 + -1;
                memcpy(__dest_00,local_2180,(long)pfVar68 - (long)local_2180);
              }
              pdVar56 = pdVar91;
              pauVar64 = pauVar73;
              if (0 < iVar61) {
                do {
                  lVar54 = 0;
                  pauVar66 = pauVar64;
                  do {
                    piVar3 = &pdVar56[0xbd].pos + lVar54;
                    fVar99 = (float)*piVar3;
                    fVar102 = (float)piVar3[1];
                    fVar103 = (float)piVar3[2];
                    fVar34 = (float)piVar3[3];
                    fVar35 = *(float *)*pauVar66;
                    fVar36 = *(float *)(*pauVar66 + 4);
                    fVar37 = *(float *)(*pauVar66 + 8);
                    fVar38 = *(float *)(*pauVar66 + 0xc);
                    auVar101 = *(undefined1 (*) [16])(drmp3_L3_antialias_g_aa + lVar54 * 4);
                    lVar55 = lVar54 * 4;
                    fVar39 = *(float *)(drmp3_L3_antialias_g_aa + lVar55 + 0x20);
                    fVar40 = *(float *)(drmp3_L3_antialias_g_aa + lVar55 + 0x24);
                    fVar41 = *(float *)(drmp3_L3_antialias_g_aa + lVar55 + 0x28);
                    fVar42 = *(float *)(drmp3_L3_antialias_g_aa + lVar55 + 0x2c);
                    piVar3 = &pdVar56[0xbd].pos + lVar54;
                    *piVar3 = (int)(fVar99 * auVar101._0_4_ - fVar38 * fVar39);
                    piVar3[1] = (int)(fVar102 * auVar101._4_4_ - fVar37 * fVar40);
                    piVar3[2] = (int)(fVar103 * auVar101._8_4_ - fVar36 * fVar41);
                    piVar3[3] = (int)(fVar34 * auVar101._12_4_ - fVar35 * fVar42);
                    auVar110._4_4_ = fVar36 * auVar101._8_4_ + fVar103 * fVar41;
                    auVar110._0_4_ = fVar35 * auVar101._12_4_ + fVar34 * fVar42;
                    auVar110._8_4_ = fVar37 * auVar101._4_4_ + fVar102 * fVar40;
                    auVar110._12_4_ = fVar38 * auVar101._0_4_ + fVar99 * fVar39;
                    *pauVar66 = auVar110;
                    lVar54 = lVar54 + 4;
                    pauVar66 = pauVar66 + -1;
                  } while (lVar54 == 4);
                  bVar98 = 1 < iVar61;
                  pdVar56 = (drmp3_bs *)&pdVar56[4].pos;
                  pauVar64 = (undefined1 (*) [16])(pauVar64[4] + 8);
                  iVar61 = iVar61 + -1;
                } while (bVar98);
              }
              pfVar68 = local_3420 + uVar67 * 0x240;
              overlap = dec->mdct_overlap + uVar67;
              cVar4 = *(char *)((long)plVar74 + 0xf);
              if ((char)lVar71 != '\0') {
                drmp3_L3_imdct36(pfVar68,*overlap,(float *)drmp3_L3_imdct_gr_g_mdct_window,iVar47);
                pfVar68 = (float *)((long)pfVar68 + (ulong)(uint)(iVar47 * 0x48));
                overlap = (float (*) [288])((long)*overlap + (ulong)(uint)(iVar47 * 0x24));
              }
              if (cVar4 == '\x02') {
                iVar47 = 0x21 - iVar47;
                lVar71 = 0;
                do {
                  pfVar58 = (float *)((long)pfVar68 + lVar71 * 2);
                  pfVar76 = pfVar58;
                  pfVar78 = (float *)&local_4338;
                  for (lVar54 = 0x12; lVar54 != 0; lVar54 = lVar54 + -1) {
                    *pfVar78 = *pfVar76;
                    pfVar76 = pfVar76 + (ulong)bVar45 * -2 + 1;
                    pfVar78 = pfVar78 + (ulong)bVar45 * -2 + 1;
                  }
                  pfVar76 = (float *)((long)*overlap + lVar71 + 0x18);
                  *(undefined8 *)(pfVar58 + 4) = *(undefined8 *)(pfVar76 + -2);
                  uVar43 = *(undefined8 *)(pfVar76 + -4);
                  *(undefined8 *)pfVar58 = *(undefined8 *)(pfVar76 + -6);
                  *(undefined8 *)(pfVar58 + 2) = uVar43;
                  drmp3_L3_imdct12((float *)&local_4338,(float *)((long)pfVar68 + lVar71 * 2 + 0x18)
                                   ,pfVar76);
                  drmp3_L3_imdct12(&fStack_4334,(float *)((long)pfVar68 + lVar71 * 2 + 0x30),pfVar76
                                  );
                  drmp3_L3_imdct12((float *)&local_4330,(float *)((long)*overlap + lVar71),pfVar76);
                  iVar47 = iVar47 + -1;
                  lVar71 = lVar71 + 0x24;
                } while (1 < iVar47);
              }
              else {
                drmp3_L3_imdct36(pfVar68,*overlap,
                                 (float *)(drmp3_L3_imdct_gr_g_mdct_window +
                                          (ulong)(cVar4 == '\x03') * 0x48),0x20 - iVar47);
              }
              puVar57 = puVar80;
              uVar85 = 0;
              do {
                uVar63 = 0xffffffffffffffff;
                do {
                  *(uint *)(puVar57 + uVar63 * 4 + 4) =
                       *(uint *)(puVar57 + uVar63 * 4 + 4) ^ (uint)DAT_00112090;
                  uVar63 = uVar63 + 2;
                } while (uVar63 < 0x10);
                puVar57 = puVar57 + 0x90;
                bVar98 = uVar85 < 0x1e;
                uVar85 = uVar85 + 2;
              } while (bVar98);
              uVar67 = uVar67 + 1;
              plVar74 = plVar74 + 4;
              pauVar73 = pauVar73 + 0x90;
              pdVar91 = pdVar91 + 0x90;
              puVar80 = puVar80 + 0x900;
            } while (uVar67 != local_4358);
          }
          pdVar93 = local_4370;
          pdVar96 = local_4380;
          drmp3d_synth_granule
                    (local_4350,local_3420,0x12,local_4370->channels,local_4380,local_2180);
          if ((local_4378[1] & 8) == 0) break;
          pdVar96 = pdVar96 + (long)pdVar93->channels * 0x240;
          uVar67 = (ulong)((int)local_4348 + 1);
        } while ((int)local_4348 == 0);
      }
      uVar85 = local_3fb0.pos + 7U >> 3;
      uVar65 = ((uint)local_3fb0.limit >> 3) - uVar85;
      uVar51 = 0x1ff;
      if ((int)uVar65 < 0x1ff) {
        uVar51 = uVar65;
      }
      if (0 < (int)uVar65) {
        if (0x1ff < (int)uVar65) {
          uVar85 = ((uint)local_3fb0.limit >> 3) - 0x1ff;
        }
        memcpy(dec->reserv_buf,local_3fa0 + uVar85,(ulong)uVar51);
      }
      uVar46 = (uint)((int)uVar70 <= (int)uVar46);
      dec->reserv = uVar51;
      bVar98 = true;
    }
    if (!bVar98) {
      return 0;
    }
  }
  else {
    if (local_4380 == (drmp3d_sample_t *)0x0) {
      if ((~bVar79 & 6) != 0) {
        return 0x480 >> ((bVar79 & 0xe) == 2);
      }
      return 0x180;
    }
    bVar45 = puVar89[3] >> 6;
    if (bVar45 == 3) {
      uVar46 = 0;
    }
    else if (bVar45 == 1) {
      uVar46 = (puVar89[3] >> 2 & 0xc) + 4;
    }
    else {
      uVar46 = 0x20;
    }
    if ((~bVar79 & 6) == 0) {
      puVar80 = &drmp3_L12_subband_alloc_table_g_alloc_L1;
      uVar51 = 0x20;
    }
    else if ((bVar79 & 8) == 0) {
      puVar80 = &drmp3_L12_subband_alloc_table_g_alloc_L2M2;
      uVar51 = 0x1e;
    }
    else {
      bVar44 = puVar89[2] >> 2 & 3;
      bVar97 = *(byte *)((ulong)(puVar89[2] >> 4) +
                        (long)(int)((bVar79 >> 1 & 3) - 1) * 0xf + 0x11262d);
      uVar85 = 0xc0;
      if (bVar97 != 0) {
        uVar85 = (uint)bVar97 + (uint)bVar97 >> (bVar45 != 3);
      }
      if (uVar85 < 0x38) {
        uVar51 = (uint)(bVar44 == 2) * 4 + 8;
        puVar80 = (undefined1 *)&drmp3_L12_subband_alloc_table_g_alloc_L2M1_lowrate;
      }
      else {
        uVar51 = 0x1b;
        if (bVar44 != 1) {
          uVar51 = (uint)(0x5f < uVar85) * 3 + 0x1b;
        }
        puVar80 = drmp3_L12_subband_alloc_table_g_alloc_L2M1;
      }
    }
    local_4038 = (byte)uVar51;
    uVar85 = uVar51;
    if (uVar46 < uVar51) {
      uVar85 = uVar46;
    }
    uVar67 = (ulong)uVar85;
    local_4037 = (byte)uVar85;
    uVar81 = 0;
    puVar57 = drmp3_L12_read_scale_info_g_bitalloc_code_tab;
    uVar70 = 0;
    uVar63 = 0;
    do {
      if (uVar81 == uVar63) {
        uVar63 = (ulong)((int)uVar63 + (uint)(byte)puVar80[2]);
        uVar70 = (uint)(byte)puVar80[1];
        puVar57 = drmp3_L12_read_scale_info_g_bitalloc_code_tab + (byte)*puVar80;
        puVar80 = puVar80 + 3;
      }
      dVar52 = drmp3_bs_get_bits(&local_4398,uVar70);
      bVar45 = puVar57[dVar52];
      local_4036[uVar81 * 2] = bVar45;
      if (uVar81 < uVar67) {
        dVar52 = drmp3_bs_get_bits(&local_4398,uVar70);
        bVar45 = puVar57[dVar52];
      }
      if (uVar46 == 0) {
        bVar45 = 0;
      }
      local_4036[uVar81 * 2 + 1] = bVar45;
      uVar81 = uVar81 + 1;
    } while (uVar51 != uVar81);
    uVar63 = 0;
    pbVar90 = local_4036;
    do {
      bVar45 = (local_4036[uVar63] == 0) << 2 | 2;
      if ((local_4036[uVar63] != 0) && ((bVar79 & 6) != 6)) {
        dVar52 = drmp3_bs_get_bits(&local_4398,2);
        bVar45 = (byte)dVar52;
      }
      abStack_3ff6[uVar63] = bVar45;
      uVar63 = uVar63 + 1;
    } while (uVar51 * 2 != uVar63);
    pfVar68 = (float *)&local_4338;
    uVar63 = 0;
    do {
      bVar45 = *pbVar90;
      uVar46 = 0;
      if (bVar45 != 0) {
        uVar46 = 0x13U >> (abStack_3ff6[uVar63] & 0x1f) | 4;
      }
      pbVar90 = pbVar90 + 1;
      fVar99 = 0.0;
      uVar70 = 4;
      do {
        if ((uVar70 & uVar46) != 0) {
          dVar52 = drmp3_bs_get_bits(&local_4398,6);
          fVar99 = (float)(int)(0x200000 >> ((byte)((int)dVar52 / 3) & 0x1f)) *
                   *(float *)(drmp3_L12_read_scalefactors_g_deq_L12 +
                             (long)(int)((int)dVar52 % 3 + (uint)bVar45 + (uint)bVar45 * 2 + -6) * 4
                             );
        }
        pdVar96 = local_4380;
        *pfVar68 = fVar99;
        pfVar68 = pfVar68 + 1;
        bVar98 = 1 < uVar70;
        uVar70 = uVar70 >> 1;
      } while (bVar98);
      uVar63 = uVar63 + 1;
    } while (uVar63 != uVar51 * 2);
    if (uVar85 < uVar51) {
      lVar54 = uVar51 - uVar67;
      lVar71 = lVar54 + -1;
      auVar101._8_4_ = (int)lVar71;
      auVar101._0_8_ = lVar71;
      auVar101._12_4_ = (int)((ulong)lVar71 >> 0x20);
      lVar71 = uVar67 * 2;
      uVar67 = 0;
      do {
        auVar132._8_4_ = (int)uVar67;
        auVar132._0_8_ = uVar67;
        auVar132._12_4_ = (int)(uVar67 >> 0x20);
        auVar134 = auVar101 ^ _DAT_00112090;
        auVar136 = (auVar132 | _DAT_00112080) ^ _DAT_00112090;
        iVar47 = auVar134._0_4_;
        iVar49 = -(uint)(iVar47 < auVar136._0_4_);
        iVar61 = auVar134._4_4_;
        auVar138._4_4_ = -(uint)(iVar61 < auVar136._4_4_);
        iVar69 = auVar134._8_4_;
        iVar152 = -(uint)(iVar69 < auVar136._8_4_);
        iVar48 = auVar134._12_4_;
        auVar138._12_4_ = -(uint)(iVar48 < auVar136._12_4_);
        auVar111._4_4_ = iVar49;
        auVar111._0_4_ = iVar49;
        auVar111._8_4_ = iVar152;
        auVar111._12_4_ = iVar152;
        auVar111 = pshuflw(in_XMM1,auVar111,0xe8);
        auVar137._4_4_ = -(uint)(auVar136._4_4_ == iVar61);
        auVar137._12_4_ = -(uint)(auVar136._12_4_ == iVar48);
        auVar137._0_4_ = auVar137._4_4_;
        auVar137._8_4_ = auVar137._12_4_;
        auVar122 = pshuflw(in_XMM2,auVar137,0xe8);
        auVar138._0_4_ = auVar138._4_4_;
        auVar138._8_4_ = auVar138._12_4_;
        auVar136 = pshuflw(auVar111,auVar138,0xe8);
        auVar134._8_4_ = 0xffffffff;
        auVar134._0_8_ = 0xffffffffffffffff;
        auVar134._12_4_ = 0xffffffff;
        auVar134 = (auVar136 | auVar122 & auVar111) ^ auVar134;
        auVar134 = packssdw(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 1] = 0;
        }
        auVar122._4_4_ = iVar49;
        auVar122._0_4_ = iVar49;
        auVar122._8_4_ = iVar152;
        auVar122._12_4_ = iVar152;
        auVar138 = auVar137 & auVar122 | auVar138;
        auVar134 = packssdw(auVar138,auVar138);
        auVar136._8_4_ = 0xffffffff;
        auVar136._0_8_ = 0xffffffffffffffff;
        auVar136._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 ^ auVar136,auVar134 ^ auVar136);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._0_4_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 3] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112070) ^ _DAT_00112090;
        auVar123._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar123._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar123._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar123._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar139._4_4_ = auVar123._0_4_;
        auVar139._0_4_ = auVar123._0_4_;
        auVar139._8_4_ = auVar123._8_4_;
        auVar139._12_4_ = auVar123._8_4_;
        iVar49 = -(uint)(auVar134._4_4_ == iVar61);
        iVar152 = -(uint)(auVar134._12_4_ == iVar48);
        auVar22._4_4_ = iVar49;
        auVar22._0_4_ = iVar49;
        auVar22._8_4_ = iVar152;
        auVar22._12_4_ = iVar152;
        auVar149._4_4_ = auVar123._4_4_;
        auVar149._0_4_ = auVar123._4_4_;
        auVar149._8_4_ = auVar123._12_4_;
        auVar149._12_4_ = auVar123._12_4_;
        auVar134 = auVar22 & auVar139 | auVar149;
        auVar134 = packssdw(auVar134,auVar134);
        auVar13._8_4_ = 0xffffffff;
        auVar13._0_8_ = 0xffffffffffffffff;
        auVar13._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 ^ auVar13,auVar134 ^ auVar13);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._0_4_ >> 0x10 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 5] = 0;
        }
        auVar134 = pshufhw(auVar134,auVar139,0x84);
        auVar23._4_4_ = iVar49;
        auVar23._0_4_ = iVar49;
        auVar23._8_4_ = iVar152;
        auVar23._12_4_ = iVar152;
        auVar136 = pshufhw(auVar123,auVar23,0x84);
        auVar111 = pshufhw(auVar134,auVar149,0x84);
        auVar112._8_4_ = 0xffffffff;
        auVar112._0_8_ = 0xffffffffffffffff;
        auVar112._12_4_ = 0xffffffff;
        auVar112 = (auVar111 | auVar136 & auVar134) ^ auVar112;
        auVar134 = packssdw(auVar112,auVar112);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._0_4_ >> 0x18 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 7] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112060) ^ _DAT_00112090;
        auVar124._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar124._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar124._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar124._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar24._4_4_ = auVar124._0_4_;
        auVar24._0_4_ = auVar124._0_4_;
        auVar24._8_4_ = auVar124._8_4_;
        auVar24._12_4_ = auVar124._8_4_;
        auVar136 = pshuflw(auVar149,auVar24,0xe8);
        auVar113._0_4_ = -(uint)(auVar134._0_4_ == iVar47);
        auVar113._4_4_ = -(uint)(auVar134._4_4_ == iVar61);
        auVar113._8_4_ = -(uint)(auVar134._8_4_ == iVar69);
        auVar113._12_4_ = -(uint)(auVar134._12_4_ == iVar48);
        auVar140._4_4_ = auVar113._4_4_;
        auVar140._0_4_ = auVar113._4_4_;
        auVar140._8_4_ = auVar113._12_4_;
        auVar140._12_4_ = auVar113._12_4_;
        auVar134 = pshuflw(auVar113,auVar140,0xe8);
        auVar141._4_4_ = auVar124._4_4_;
        auVar141._0_4_ = auVar124._4_4_;
        auVar141._8_4_ = auVar124._12_4_;
        auVar141._12_4_ = auVar124._12_4_;
        auVar111 = pshuflw(auVar124,auVar141,0xe8);
        auVar14._8_4_ = 0xffffffff;
        auVar14._0_8_ = 0xffffffffffffffff;
        auVar14._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 & auVar136,(auVar111 | auVar134 & auVar136) ^ auVar14);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 9] = 0;
        }
        auVar25._4_4_ = auVar124._0_4_;
        auVar25._0_4_ = auVar124._0_4_;
        auVar25._8_4_ = auVar124._8_4_;
        auVar25._12_4_ = auVar124._8_4_;
        auVar141 = auVar140 & auVar25 | auVar141;
        auVar111 = packssdw(auVar141,auVar141);
        auVar15._8_4_ = 0xffffffff;
        auVar15._0_8_ = 0xffffffffffffffff;
        auVar15._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134,auVar111 ^ auVar15);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._4_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0xb] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112050) ^ _DAT_00112090;
        auVar125._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar125._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar125._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar125._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar142._4_4_ = auVar125._0_4_;
        auVar142._0_4_ = auVar125._0_4_;
        auVar142._8_4_ = auVar125._8_4_;
        auVar142._12_4_ = auVar125._8_4_;
        iVar49 = -(uint)(auVar134._4_4_ == iVar61);
        iVar152 = -(uint)(auVar134._12_4_ == iVar48);
        auVar26._4_4_ = iVar49;
        auVar26._0_4_ = iVar49;
        auVar26._8_4_ = iVar152;
        auVar26._12_4_ = iVar152;
        auVar150._4_4_ = auVar125._4_4_;
        auVar150._0_4_ = auVar125._4_4_;
        auVar150._8_4_ = auVar125._12_4_;
        auVar150._12_4_ = auVar125._12_4_;
        auVar134 = auVar26 & auVar142 | auVar150;
        auVar134 = packssdw(auVar134,auVar134);
        auVar16._8_4_ = 0xffffffff;
        auVar16._0_8_ = 0xffffffffffffffff;
        auVar16._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 ^ auVar16,auVar134 ^ auVar16);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 0xd] = 0;
        }
        auVar134 = pshufhw(auVar134,auVar142,0x84);
        auVar27._4_4_ = iVar49;
        auVar27._0_4_ = iVar49;
        auVar27._8_4_ = iVar152;
        auVar27._12_4_ = iVar152;
        auVar136 = pshufhw(auVar125,auVar27,0x84);
        auVar111 = pshufhw(auVar134,auVar150,0x84);
        auVar114._8_4_ = 0xffffffff;
        auVar114._0_8_ = 0xffffffffffffffff;
        auVar114._12_4_ = 0xffffffff;
        auVar114 = (auVar111 | auVar136 & auVar134) ^ auVar114;
        auVar134 = packssdw(auVar114,auVar114);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._6_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0xf] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112040) ^ _DAT_00112090;
        auVar126._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar126._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar126._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar126._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar28._4_4_ = auVar126._0_4_;
        auVar28._0_4_ = auVar126._0_4_;
        auVar28._8_4_ = auVar126._8_4_;
        auVar28._12_4_ = auVar126._8_4_;
        auVar136 = pshuflw(auVar150,auVar28,0xe8);
        auVar115._0_4_ = -(uint)(auVar134._0_4_ == iVar47);
        auVar115._4_4_ = -(uint)(auVar134._4_4_ == iVar61);
        auVar115._8_4_ = -(uint)(auVar134._8_4_ == iVar69);
        auVar115._12_4_ = -(uint)(auVar134._12_4_ == iVar48);
        auVar143._4_4_ = auVar115._4_4_;
        auVar143._0_4_ = auVar115._4_4_;
        auVar143._8_4_ = auVar115._12_4_;
        auVar143._12_4_ = auVar115._12_4_;
        auVar134 = pshuflw(auVar115,auVar143,0xe8);
        auVar144._4_4_ = auVar126._4_4_;
        auVar144._0_4_ = auVar126._4_4_;
        auVar144._8_4_ = auVar126._12_4_;
        auVar144._12_4_ = auVar126._12_4_;
        auVar111 = pshuflw(auVar126,auVar144,0xe8);
        auVar127._8_4_ = 0xffffffff;
        auVar127._0_8_ = 0xffffffffffffffff;
        auVar127._12_4_ = 0xffffffff;
        auVar127 = (auVar111 | auVar134 & auVar136) ^ auVar127;
        auVar111 = packssdw(auVar127,auVar127);
        auVar134 = packsswb(auVar134 & auVar136,auVar111);
        if ((auVar134 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 0x11] = 0;
        }
        auVar29._4_4_ = auVar126._0_4_;
        auVar29._0_4_ = auVar126._0_4_;
        auVar29._8_4_ = auVar126._8_4_;
        auVar29._12_4_ = auVar126._8_4_;
        auVar144 = auVar143 & auVar29 | auVar144;
        auVar111 = packssdw(auVar144,auVar144);
        auVar17._8_4_ = 0xffffffff;
        auVar17._0_8_ = 0xffffffffffffffff;
        auVar17._12_4_ = 0xffffffff;
        auVar111 = packssdw(auVar111 ^ auVar17,auVar111 ^ auVar17);
        auVar134 = packsswb(auVar134,auVar111);
        if ((auVar134._8_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0x13] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112030) ^ _DAT_00112090;
        auVar128._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar128._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar128._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar128._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar145._4_4_ = auVar128._0_4_;
        auVar145._0_4_ = auVar128._0_4_;
        auVar145._8_4_ = auVar128._8_4_;
        auVar145._12_4_ = auVar128._8_4_;
        iVar49 = -(uint)(auVar134._4_4_ == iVar61);
        iVar152 = -(uint)(auVar134._12_4_ == iVar48);
        auVar30._4_4_ = iVar49;
        auVar30._0_4_ = iVar49;
        auVar30._8_4_ = iVar152;
        auVar30._12_4_ = iVar152;
        auVar151._4_4_ = auVar128._4_4_;
        auVar151._0_4_ = auVar128._4_4_;
        auVar151._8_4_ = auVar128._12_4_;
        auVar151._12_4_ = auVar128._12_4_;
        auVar134 = auVar30 & auVar145 | auVar151;
        auVar134 = packssdw(auVar134,auVar134);
        auVar18._8_4_ = 0xffffffff;
        auVar18._0_8_ = 0xffffffffffffffff;
        auVar18._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 ^ auVar18,auVar134 ^ auVar18);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 0x15] = 0;
        }
        auVar134 = pshufhw(auVar134,auVar145,0x84);
        auVar31._4_4_ = iVar49;
        auVar31._0_4_ = iVar49;
        auVar31._8_4_ = iVar152;
        auVar31._12_4_ = iVar152;
        auVar136 = pshufhw(auVar128,auVar31,0x84);
        auVar111 = pshufhw(auVar134,auVar151,0x84);
        auVar116._8_4_ = 0xffffffff;
        auVar116._0_8_ = 0xffffffffffffffff;
        auVar116._12_4_ = 0xffffffff;
        auVar116 = (auVar111 | auVar136 & auVar134) ^ auVar116;
        auVar134 = packssdw(auVar116,auVar116);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._10_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0x17] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112020) ^ _DAT_00112090;
        auVar129._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar129._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar129._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar129._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar32._4_4_ = auVar129._0_4_;
        auVar32._0_4_ = auVar129._0_4_;
        auVar32._8_4_ = auVar129._8_4_;
        auVar32._12_4_ = auVar129._8_4_;
        auVar136 = pshuflw(auVar151,auVar32,0xe8);
        auVar117._0_4_ = -(uint)(auVar134._0_4_ == iVar47);
        auVar117._4_4_ = -(uint)(auVar134._4_4_ == iVar61);
        auVar117._8_4_ = -(uint)(auVar134._8_4_ == iVar69);
        auVar117._12_4_ = -(uint)(auVar134._12_4_ == iVar48);
        auVar146._4_4_ = auVar117._4_4_;
        auVar146._0_4_ = auVar117._4_4_;
        auVar146._8_4_ = auVar117._12_4_;
        auVar146._12_4_ = auVar117._12_4_;
        auVar134 = pshuflw(auVar117,auVar146,0xe8);
        auVar147._4_4_ = auVar129._4_4_;
        auVar147._0_4_ = auVar129._4_4_;
        auVar147._8_4_ = auVar129._12_4_;
        auVar147._12_4_ = auVar129._12_4_;
        auVar111 = pshuflw(auVar129,auVar147,0xe8);
        auVar19._8_4_ = 0xffffffff;
        auVar19._0_8_ = 0xffffffffffffffff;
        auVar19._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 & auVar136,(auVar111 | auVar134 & auVar136) ^ auVar19);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 0x19] = 0;
        }
        auVar33._4_4_ = auVar129._0_4_;
        auVar33._0_4_ = auVar129._0_4_;
        auVar33._8_4_ = auVar129._8_4_;
        auVar33._12_4_ = auVar129._8_4_;
        auVar147 = auVar146 & auVar33 | auVar147;
        auVar111 = packssdw(auVar147,auVar147);
        auVar20._8_4_ = 0xffffffff;
        auVar20._0_8_ = 0xffffffffffffffff;
        auVar20._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134,auVar111 ^ auVar20);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134._12_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0x1b] = 0;
        }
        auVar134 = (auVar132 | _DAT_00112010) ^ _DAT_00112090;
        auVar118._0_4_ = -(uint)(iVar47 < auVar134._0_4_);
        auVar118._4_4_ = -(uint)(iVar61 < auVar134._4_4_);
        auVar118._8_4_ = -(uint)(iVar69 < auVar134._8_4_);
        auVar118._12_4_ = -(uint)(iVar48 < auVar134._12_4_);
        auVar148._4_4_ = auVar118._0_4_;
        auVar148._0_4_ = auVar118._0_4_;
        auVar148._8_4_ = auVar118._8_4_;
        auVar148._12_4_ = auVar118._8_4_;
        auVar133._4_4_ = -(uint)(auVar134._4_4_ == iVar61);
        auVar133._12_4_ = -(uint)(auVar134._12_4_ == iVar48);
        auVar133._0_4_ = auVar133._4_4_;
        auVar133._8_4_ = auVar133._12_4_;
        auVar135._4_4_ = auVar118._4_4_;
        auVar135._0_4_ = auVar118._4_4_;
        auVar135._8_4_ = auVar118._12_4_;
        auVar135._12_4_ = auVar118._12_4_;
        auVar111 = auVar133 & auVar148 | auVar135;
        auVar134 = packssdw(auVar118,auVar111);
        auVar21._8_4_ = 0xffffffff;
        auVar21._0_8_ = 0xffffffffffffffff;
        auVar21._12_4_ = 0xffffffff;
        auVar134 = packssdw(auVar134 ^ auVar21,auVar134 ^ auVar21);
        auVar134 = packsswb(auVar134,auVar134);
        if ((auVar134 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          local_4036[uVar67 * 2 + lVar71 + 0x1d] = 0;
        }
        auVar134 = pshufhw(auVar134,auVar148,0x84);
        in_XMM2 = pshufhw(auVar111,auVar133,0x84);
        in_XMM2 = in_XMM2 & auVar134;
        auVar134 = pshufhw(auVar134,auVar135,0x84);
        auVar119._8_4_ = 0xffffffff;
        auVar119._0_8_ = 0xffffffffffffffff;
        auVar119._12_4_ = 0xffffffff;
        auVar119 = (auVar134 | in_XMM2) ^ auVar119;
        auVar134 = packssdw(auVar119,auVar119);
        in_XMM1 = packsswb(auVar134,auVar134);
        if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
          local_4036[uVar67 * 2 + lVar71 + 0x1f] = 0;
        }
        uVar67 = uVar67 + 0x10;
      } while ((lVar54 + 0xfU & 0xfffffffffffffff0) != uVar67);
    }
    lVar71 = 0;
    memset(local_3420,0,0x1200);
    iVar47 = 0;
    local_4380 = pdVar96;
    do {
      bVar45 = local_4038;
      local_4368 = (drmp3_uint8 *)lVar71;
      uVar46 = local_4370->layer;
      uVar67 = (ulong)local_4038;
      uVar63 = (ulong)uVar46 | 1;
      uVar85 = (uint)local_4038;
      iVar61 = 0x240;
      lVar71 = 0;
      do {
        local_43f0._0_4_ = (uint)bVar45;
        if ((uint)local_43f0 != 0) {
          pfVar68 = local_3420 + (long)iVar47 + lVar71 * ((long)(int)uVar46 | 1U);
          uVar81 = 0;
          do {
            bVar79 = local_4036[uVar81];
            if (bVar79 != 0) {
              if (bVar79 < 0x11) {
                if (-1 < (int)uVar46) {
                  uVar94 = 0;
                  do {
                    dVar52 = drmp3_bs_get_bits(&local_4398,(uint)bVar79);
                    pfVar68[uVar94] = (float)(int)(dVar52 + (-1 << (bVar79 - 1 & 0x1f)) + 1);
                    uVar94 = uVar94 + 1;
                  } while (uVar63 != uVar94);
                }
              }
              else {
                uVar51 = 2 << (bVar79 - 0x11 & 0x1f);
                dVar52 = drmp3_bs_get_bits(&local_4398,(uVar51 - (uVar51 >> 3)) + 3);
                if (-1 < (int)uVar46) {
                  uVar94 = 0;
                  do {
                    pfVar68[uVar94] = (float)(int)(dVar52 % (uVar51 + 1) - (uVar51 >> 1));
                    uVar94 = uVar94 + 1;
                    dVar52 = dVar52 / (uVar51 + 1);
                  } while (uVar63 != uVar94);
                }
              }
            }
            pfVar68 = pfVar68 + iVar61;
            iVar61 = 0x12 - iVar61;
            uVar81 = uVar81 + 1;
          } while (uVar81 != uVar85 * 2);
        }
        lVar71 = lVar71 + 1;
      } while (lVar71 != 4);
      iVar47 = iVar47 + (int)uVar63 * 4;
      if (iVar47 == 0xc) {
        memcpy(local_2b20 + (uint)local_4037 * 0x48,
               (void *)((ulong)((uint)local_4037 * 0x48) + (long)local_3420),
               (uVar67 - local_4037) * 0x48);
        pdVar72 = local_4368;
        pdVar93 = local_4370;
        pdVar96 = local_4380;
        if ((uint)local_43f0 != 0) {
          pfVar58 = (float *)(&local_4338 + (long)local_4368);
          uVar46 = 0;
          pfVar68 = local_3420;
          do {
            fVar99 = *pfVar58;
            fVar102 = pfVar58[3];
            lVar71 = 0;
            do {
              pfVar76 = pfVar68 + lVar71;
              fVar103 = pfVar76[1];
              fVar34 = pfVar76[2];
              fVar35 = pfVar76[3];
              pfVar78 = pfVar68 + lVar71;
              *pfVar78 = *pfVar76 * fVar99;
              pfVar78[1] = fVar103 * fVar99;
              pfVar78[2] = fVar34 * fVar99;
              pfVar78[3] = fVar35 * fVar99;
              pfVar76 = pfVar68 + lVar71 + 0x240;
              auVar130._0_4_ = *pfVar76 * fVar102;
              auVar130._4_4_ = pfVar76[1] * fVar102;
              auVar130._8_4_ = pfVar76[2] * fVar102;
              auVar130._12_4_ = pfVar76[3] * fVar102;
              *(undefined1 (*) [16])(pfVar68 + lVar71 + 0x240) = auVar130;
              lVar71 = lVar71 + 4;
            } while (lVar71 != 0xc);
            uVar46 = uVar46 + 1;
            pfVar68 = pfVar68 + 0x12;
            pfVar58 = pfVar58 + 6;
          } while (uVar46 != (uint)local_43f0);
        }
        drmp3d_synth_granule
                  (dec->qmf_state,local_3420,0xc,local_4370->channels,local_4380,local_2180);
        iVar47 = 0;
        memset(local_3420,0,0x1200);
        local_4380 = pdVar96 + (long)pdVar93->channels * 0x180;
        local_4368 = pdVar72;
      }
      if (local_4398.limit < local_4398.pos) {
        dec->header[0] = '\0';
        return 0;
      }
      lVar71 = (long)local_4368 + 1;
    } while (lVar71 != 3);
    uVar46 = 1;
  }
  uVar85 = 0x180;
  if ((~dec->header[1] & 6) != 0) {
    uVar85 = 0x480 >> ((dec->header[1] & 0xe) == 2);
  }
  return uVar85 * uVar46;
}

Assistant:

int drmp3dec_decode_frame(drmp3dec *dec, const unsigned char *mp3, int mp3_bytes, void *pcm, drmp3dec_frame_info *info)
{
    int i = 0, igr, frame_size = 0, success = 1;
    const drmp3_uint8 *hdr;
    drmp3_bs bs_frame[1];
    drmp3dec_scratch scratch;

    if (mp3_bytes > 4 && dec->header[0] == 0xff && drmp3_hdr_compare(dec->header, mp3))
    {
        frame_size = drmp3_hdr_frame_bytes(mp3, dec->free_format_bytes) + drmp3_hdr_padding(mp3);
        if (frame_size != mp3_bytes && (frame_size + DRMP3_HDR_SIZE > mp3_bytes || !drmp3_hdr_compare(mp3, mp3 + frame_size)))
        {
            frame_size = 0;
        }
    }
    if (!frame_size)
    {
        memset(dec, 0, sizeof(drmp3dec));
        i = drmp3d_find_frame(mp3, mp3_bytes, &dec->free_format_bytes, &frame_size);
        if (!frame_size || i + frame_size > mp3_bytes)
        {
            info->frame_bytes = i;
            return 0;
        }
    }

    hdr = mp3 + i;
    memcpy(dec->header, hdr, DRMP3_HDR_SIZE);
    info->frame_bytes = i + frame_size;
    info->channels = DRMP3_HDR_IS_MONO(hdr) ? 1 : 2;
    info->hz = drmp3_hdr_sample_rate_hz(hdr);
    info->layer = 4 - DRMP3_HDR_GET_LAYER(hdr);
    info->bitrate_kbps = drmp3_hdr_bitrate_kbps(hdr);

    drmp3_bs_init(bs_frame, hdr + DRMP3_HDR_SIZE, frame_size - DRMP3_HDR_SIZE);
    if (DRMP3_HDR_IS_CRC(hdr))
    {
        drmp3_bs_get_bits(bs_frame, 16);
    }

    if (info->layer == 3)
    {
        int main_data_begin = drmp3_L3_read_side_info(bs_frame, scratch.gr_info, hdr);
        if (main_data_begin < 0 || bs_frame->pos > bs_frame->limit)
        {
            drmp3dec_init(dec);
            return 0;
        }
        success = drmp3_L3_restore_reservoir(dec, bs_frame, &scratch, main_data_begin);
        if (success && pcm != NULL)
        {
            for (igr = 0; igr < (DRMP3_HDR_TEST_MPEG1(hdr) ? 2 : 1); igr++, pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*576*info->channels))
            {
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                drmp3_L3_decode(dec, &scratch, scratch.gr_info + igr*info->channels, info->channels);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 18, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
            }
        }
        drmp3_L3_save_reservoir(dec, &scratch);
    } else
    {
#ifdef DR_MP3_ONLY_MP3
        return 0;
#else
        if (pcm == NULL) {
            return drmp3_hdr_frame_samples(hdr);
        }

        drmp3_L12_scale_info sci[1];
        drmp3_L12_read_scale_info(hdr, bs_frame, sci);

        memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
        for (i = 0, igr = 0; igr < 3; igr++)
        {
            if (12 == (i += drmp3_L12_dequantize_granule(scratch.grbuf[0] + i, bs_frame, sci, info->layer | 1)))
            {
                i = 0;
                drmp3_L12_apply_scf_384(sci, sci->scf + igr, scratch.grbuf[0]);
                drmp3d_synth_granule(dec->qmf_state, scratch.grbuf[0], 12, info->channels, (drmp3d_sample_t*)pcm, scratch.syn[0]);
                memset(scratch.grbuf[0], 0, 576*2*sizeof(float));
                pcm = DRMP3_OFFSET_PTR(pcm, sizeof(drmp3d_sample_t)*384*info->channels);
            }
            if (bs_frame->pos > bs_frame->limit)
            {
                drmp3dec_init(dec);
                return 0;
            }
        }
#endif
    }

    return success*drmp3_hdr_frame_samples(dec->header);
}